

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLookupResultValid
               (TextureCubeArrayView *texture,Sampler *sampler,LookupPrecision *prec,
               IVec4 *coordBits,Vec4 *coord,Vec2 *lodBounds,Vec4 *result)

{
  undefined8 uVar1;
  CubeFace CVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  FilterMode FVar7;
  long lVar8;
  int layerNdx;
  int iVar9;
  int levelNdx;
  int iVar10;
  float __x;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 local_2a0 [12];
  int numPossibleFaces;
  IVec2 layerRange;
  float fStack_284;
  Vec2 local_260;
  Vec3 layerCoord;
  float local_248;
  uint uStack_244;
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces [6];
  ConstPixelBufferAccess faces1 [6];
  
  if (texture->m_numLevels < 1) {
    iVar9 = 0;
  }
  else {
    iVar9 = (texture->m_levels->m_size).m_data[2] / 6;
  }
  computeLayerRange((tcu *)&layerRange,iVar9,coordBits->m_data[3],coord->m_data[3]);
  Vector<float,_4>::toWidth<3>((Vector<float,_4> *)&layerCoord);
  numPossibleFaces = 0;
  TexVerifierUtil::getPossibleCubeFaces
            (&layerCoord,&prec->coordBits,possibleFaces,&numPossibleFaces);
  bVar3 = true;
  iVar9 = numPossibleFaces;
  layerNdx = layerRange.m_data[0];
  if (numPossibleFaces != 0) {
    for (; layerNdx <= layerRange.m_data[1]; layerNdx = layerNdx + 1) {
      for (lVar6 = 0; lVar6 < iVar9; lVar6 = lVar6 + 1) {
        CVar2 = possibleFaces[lVar6];
        projectToFace((CubeFace)faces,(Vec3 *)(ulong)CVar2);
        local_2a0._4_4_ = faces[0].m_format.order;
        local_2a0._8_4_ = faces[0].m_format.type;
        uVar1 = *(undefined8 *)lodBounds->m_data;
        fVar11 = sampler->lodThreshold;
        __x = (float)uVar1;
        local_2a0._0_4_ = CVar2;
        if (__x <= fVar11) {
          lVar8 = 0;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar8 + -8));
            lVar8 = lVar8 + 0x28;
          } while (lVar8 != 0xf0);
          getCubeArrayLevelFaces(texture,0,layerNdx,&faces);
          bVar3 = isCubeLevelSampleResultValid
                            (&faces,sampler,sampler->magFilter,prec,(CubeFaceFloatCoords *)local_2a0
                             ,result);
          if (bVar3) {
            return true;
          }
        }
        fStack_284 = (float)((ulong)uVar1 >> 0x20);
        if (fVar11 < fStack_284) {
          FVar7 = sampler->minFilter;
          iVar10 = texture->m_numLevels;
          iVar9 = iVar10 + -1;
          if (iVar9 < 1 || (FVar7 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
            if ((FVar7 == LINEAR_MIPMAP_NEAREST) || (FVar7 == NEAREST_MIPMAP_NEAREST)) {
              fVar11 = ceilf(__x + 0.5);
              iVar4 = (int)fVar11 + -1;
              iVar10 = iVar9;
              if (iVar4 < iVar9) {
                iVar10 = iVar4;
              }
              if (iVar4 < 0) {
                iVar10 = 0;
              }
              fVar11 = floorf(fStack_284 + 0.5);
              iVar4 = (int)fVar11;
              if (iVar4 < iVar9) {
                iVar9 = iVar4;
              }
              if (iVar4 < 0) {
                iVar9 = 0;
              }
              while (iVar10 <= iVar9) {
                lVar8 = 0;
                do {
                  ConstPixelBufferAccess::ConstPixelBufferAccess
                            ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar8 + -8));
                  lVar8 = lVar8 + 0x28;
                } while (lVar8 != 0xf0);
                getCubeArrayLevelFaces(texture,iVar10,layerNdx,&faces);
                uVar5 = sampler->minFilter - LINEAR;
                FVar7 = NEAREST;
                if (uVar5 < 5) {
                  FVar7 = *(FilterMode *)(&DAT_00a04ed0 + (ulong)uVar5 * 4);
                }
                bVar3 = isCubeLevelSampleResultValid
                                  (&faces,sampler,FVar7,prec,(CubeFaceFloatCoords *)local_2a0,result
                                  );
                iVar10 = iVar10 + 1;
                if (bVar3) {
                  return true;
                }
              }
            }
            else {
              lVar8 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar8 + -8));
                lVar8 = lVar8 + 0x28;
              } while (lVar8 != 0xf0);
              getCubeArrayLevelFaces(texture,0,layerNdx,&faces);
              bVar3 = isCubeLevelSampleResultValid
                                (&faces,sampler,sampler->minFilter,prec,
                                 (CubeFaceFloatCoords *)local_2a0,result);
              if (bVar3) {
                return true;
              }
            }
          }
          else {
            fVar11 = floorf(__x);
            iVar4 = (int)fVar11;
            iVar10 = iVar10 + -2;
            iVar9 = iVar10;
            if (iVar4 < iVar10) {
              iVar9 = iVar4;
            }
            if (iVar4 < 0) {
              iVar9 = 0;
            }
            fVar11 = floorf(fStack_284);
            iVar4 = (int)fVar11;
            if (iVar4 < iVar10) {
              iVar10 = iVar4;
            }
            if (iVar4 < 0) {
              iVar10 = 0;
            }
            while (iVar9 <= iVar10) {
              fVar11 = (float)iVar9;
              auVar12._4_4_ = fStack_284 - fVar11;
              auVar12._0_4_ = __x - fVar11;
              auVar12._8_4_ = 0.0 - fVar11;
              auVar12._12_4_ = 0.0 - fVar11;
              auVar12 = minps(_DAT_0093d9c0,auVar12);
              lVar8 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar8 + -8));
                lVar8 = lVar8 + 0x28;
              } while (lVar8 != 0xf0);
              lVar8 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces1[0].m_size.m_data + lVar8 + -8));
                lVar8 = lVar8 + 0x28;
              } while (lVar8 != 0xf0);
              getCubeArrayLevelFaces(texture,iVar9,layerNdx,&faces);
              iVar9 = iVar9 + 1;
              getCubeArrayLevelFaces(texture,iVar9,layerNdx,&faces1);
              uVar5 = sampler->minFilter - LINEAR;
              FVar7 = NEAREST;
              if (uVar5 < 5) {
                FVar7 = *(FilterMode *)(&DAT_00a04ed0 + (ulong)uVar5 * 4);
              }
              local_248 = auVar12._0_4_;
              uStack_244 = auVar12._4_4_;
              local_260.m_data[0] = (float)(-(uint)(0.0 <= __x - fVar11) & (uint)local_248);
              local_260.m_data[1] = (float)(-(uint)(0.0 <= fStack_284 - fVar11) & uStack_244);
              bVar3 = isCubeMipmapLinearSampleResultValid
                                (&faces,&faces1,sampler,FVar7,prec,(CubeFaceFloatCoords *)local_2a0,
                                 &local_260,result);
              if (bVar3) {
                return true;
              }
            }
          }
        }
        iVar9 = numPossibleFaces;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool isLookupResultValid (const TextureCubeArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const IVec4& coordBits, const Vec4& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2	layerRange						= computeLayerRange(texture.getNumLayers(), coordBits.w(), coord.w());
	const Vec3	layerCoord						= coord.toWidth<3>();
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(layerCoord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int layerNdx = layerRange.x(); layerNdx <= layerRange.y(); layerNdx++)
	{
		for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
		{
			const CubeFaceFloatCoords	faceCoords		(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], layerCoord));
			const float					minLod			= lodBounds.x();
			const float					maxLod			= lodBounds.y();
			const bool					canBeMagnified	= minLod <= sampler.lodThreshold;
			const bool					canBeMinified	= maxLod > sampler.lodThreshold;

			if (canBeMagnified)
			{
				ConstPixelBufferAccess faces[CUBEFACE_LAST];
				getCubeArrayLevelFaces(texture, 0, layerNdx, faces);

				if (isCubeLevelSampleResultValid(faces, sampler, sampler.magFilter, prec, faceCoords, result))
					return true;
			}

			if (canBeMinified)
			{
				const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
				const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
				const int	minTexLevel		= 0;
				const int	maxTexLevel		= texture.getNumLevels()-1;

				DE_ASSERT(minTexLevel <= maxTexLevel);

				if (isLinearMipmap && minTexLevel < maxTexLevel)
				{
					const int	minLevel	= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
					const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

					DE_ASSERT(minLevel <= maxLevel);

					for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
					{
						const float		minF	= de::clamp(minLod - float(levelNdx), 0.0f, 1.0f);
						const float		maxF	= de::clamp(maxLod - float(levelNdx), 0.0f, 1.0f);

						ConstPixelBufferAccess	faces0[CUBEFACE_LAST];
						ConstPixelBufferAccess	faces1[CUBEFACE_LAST];

						getCubeArrayLevelFaces(texture, levelNdx,		layerNdx,	faces0);
						getCubeArrayLevelFaces(texture, levelNdx + 1,	layerNdx,	faces1);

						if (isCubeMipmapLinearSampleResultValid(faces0, faces1, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, Vec2(minF, maxF), result))
							return true;
					}
				}
				else if (isNearestMipmap)
				{
					// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
					//		 decision to allow floor(lod + 0.5) as well.
					const int	minLevel	= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
					const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

					DE_ASSERT(minLevel <= maxLevel);

					for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
					{
						ConstPixelBufferAccess faces[CUBEFACE_LAST];
						getCubeArrayLevelFaces(texture, levelNdx, layerNdx, faces);

						if (isCubeLevelSampleResultValid(faces, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, result))
							return true;
					}
				}
				else
				{
					ConstPixelBufferAccess faces[CUBEFACE_LAST];
					getCubeArrayLevelFaces(texture, 0, layerNdx, faces);

					if (isCubeLevelSampleResultValid(faces, sampler, sampler.minFilter, prec, faceCoords, result))
						return true;
				}
			}
		}
	}

	return false;
}